

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationbuilder.cpp
# Opt level: O2

int64_t __thiscall icu_63::CEFinalizer::modifyCE32(CEFinalizer *this,uint32_t ce32)

{
  int64_t *piVar1;
  UBool UVar2;
  int32_t iVar3;
  ulong uVar4;
  
  UVar2 = CollationBuilder::isTempCE32(ce32);
  if (UVar2 == '\0') {
    uVar4 = 0x101000100;
  }
  else {
    piVar1 = this->finalCEs;
    iVar3 = CollationBuilder::indexFromTempCE32(ce32);
    uVar4 = (ulong)((ce32 & 0xc0) << 8) | piVar1[iVar3];
  }
  return uVar4;
}

Assistant:

virtual int64_t modifyCE32(uint32_t ce32) const {
        U_ASSERT(!Collation::isSpecialCE32(ce32));
        if(CollationBuilder::isTempCE32(ce32)) {
            // retain case bits
            return finalCEs[CollationBuilder::indexFromTempCE32(ce32)] | ((ce32 & 0xc0) << 8);
        } else {
            return Collation::NO_CE;
        }
    }